

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::Graph(Graph *this,int nv)

{
  memset(this,0,0x2714);
  this->adjoint_status = true;
  this->line_status = true;
  this->multigraph_status = false;
  memset(this->adj_list,0,0xe10);
  this->num_of_vert = nv;
  createMatrix(this);
  createList(this);
  createPredList(this);
  return;
}

Assistant:

Graph::Graph(int nv){
   this->num_of_vert = nv;
   this->createMatrix();
   this->createList();
   this->createPredList();
}